

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_tt_GetPackedQuad(nk_tt_packedchar *chardata,int pw,int ph,int char_index,float *xpos,
                        float *ypos,nk_tt_aligned_quad *q,int align_to_integer)

{
  int iVar1;
  int iVar2;
  nk_tt_packedchar *pnVar3;
  float y;
  float x;
  int ty;
  int tx;
  nk_tt_packedchar *b;
  float iph;
  float ipw;
  float *ypos_local;
  float *xpos_local;
  int char_index_local;
  int ph_local;
  int pw_local;
  nk_tt_packedchar *chardata_local;
  
  pnVar3 = chardata + char_index;
  if (align_to_integer == 0) {
    q->x0 = *xpos + pnVar3->xoff;
    q->y0 = *ypos + pnVar3->yoff;
    q->x1 = *xpos + pnVar3->xoff2;
    q->y1 = *ypos + pnVar3->yoff2;
  }
  else {
    iVar1 = nk_ifloorf(*xpos + pnVar3->xoff + 0.5);
    iVar2 = nk_ifloorf(*ypos + pnVar3->yoff + 0.5);
    q->x0 = (float)iVar1;
    q->y0 = (float)iVar2;
    q->x1 = ((float)iVar1 + pnVar3->xoff2) - pnVar3->xoff;
    q->y1 = ((float)iVar2 + pnVar3->yoff2) - pnVar3->yoff;
  }
  q->s0 = (float)pnVar3->x0 * (1.0 / (float)pw);
  q->t0 = (float)pnVar3->y0 * (1.0 / (float)ph);
  q->s1 = (float)pnVar3->x1 * (1.0 / (float)pw);
  q->t1 = (float)pnVar3->y1 * (1.0 / (float)ph);
  *xpos = pnVar3->xadvance + *xpos;
  return;
}

Assistant:

NK_INTERN void
nk_tt_GetPackedQuad(struct nk_tt_packedchar *chardata, int pw, int ph,
    int char_index, float *xpos, float *ypos, struct nk_tt_aligned_quad *q,
    int align_to_integer)
{
    float ipw = 1.0f / (float)pw, iph = 1.0f / (float)ph;
    struct nk_tt_packedchar *b = (struct nk_tt_packedchar*)(chardata + char_index);
    if (align_to_integer) {
        int tx = nk_ifloorf((*xpos + b->xoff) + 0.5f);
        int ty = nk_ifloorf((*ypos + b->yoff) + 0.5f);

        float x = (float)tx;
        float y = (float)ty;

        q->x0 = x;
        q->y0 = y;
        q->x1 = x + b->xoff2 - b->xoff;
        q->y1 = y + b->yoff2 - b->yoff;
    } else {
        q->x0 = *xpos + b->xoff;
        q->y0 = *ypos + b->yoff;
        q->x1 = *xpos + b->xoff2;
        q->y1 = *ypos + b->yoff2;
    }
    q->s0 = b->x0 * ipw;
    q->t0 = b->y0 * iph;
    q->s1 = b->x1 * ipw;
    q->t1 = b->y1 * iph;
    *xpos += b->xadvance;
}